

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O3

void __thiscall Catch::JunitReporter::writeAssertion(JunitReporter *this,AssertionStats *stats)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  OfType OVar2;
  ostream *os;
  pointer pMVar3;
  StringRef attribute;
  StringRef text;
  bool bVar4;
  Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *pSVar5;
  size_t sVar6;
  char *pcVar7;
  XmlWriter *this_00;
  MessageInfo *msg;
  pointer pMVar8;
  StringRef name;
  StringRef name_00;
  string elementName;
  ReusableStringStream rss;
  ScopedElement e;
  char local_d1;
  Column local_d0;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  ReusableStringStream local_70;
  string local_60;
  
  OVar2 = (stats->assertionResult).m_resultData.resultType;
  if (((OVar2 & FailureBit) == Ok) ||
     (((stats->assertionResult).m_info.resultDisposition & SuppressFail) != 0)) {
    if (OVar2 != ExplicitSkip) {
      return;
    }
    local_98 = &local_80;
    local_88 = 0;
    local_80 = 0;
    local_90 = local_98;
    std::__cxx11::string::_M_replace((ulong)&local_90,0,(char *)0x0,0x1f7517);
    goto LAB_0013e6b6;
  }
  local_98 = &local_80;
  local_88 = 0;
  local_80 = 0;
  pcVar7 = "failure";
  local_90 = local_98;
  if (OVar2 < Exception) {
    if (1 < (uint)(OVar2 + ~FailureBit)) {
      if ((OVar2 != Unknown) && (OVar2 != FailureBit)) goto LAB_0013e6b6;
LAB_0013e67e:
      pcVar7 = "internalError";
    }
  }
  else {
    if (OVar2 < DidntThrowException) {
      if (OVar2 == Exception) goto LAB_0013e67e;
      if (OVar2 != ThrewException) goto LAB_0013e6b6;
    }
    else {
      if (OVar2 == DidntThrowException) goto LAB_0013e6a8;
      if (OVar2 != FatalErrorCondition) goto LAB_0013e6b6;
    }
    pcVar7 = "error";
  }
LAB_0013e6a8:
  std::__cxx11::string::_M_replace((ulong)&local_90,0,(char *)0x0,(ulong)pcVar7);
LAB_0013e6b6:
  this_00 = &this->xml;
  XmlWriter::scopedElement
            ((XmlWriter *)&stack0xffffffffffffffc0,(string *)this_00,(XmlFormatting)&local_90);
  AssertionResult::getExpression_abi_cxx11_(&local_d0.m_string,&stats->assertionResult);
  attribute.m_start._1_7_ = local_d0.m_string._M_dataplus._M_p._1_7_;
  attribute.m_start._0_1_ = local_d0.m_string._M_dataplus._M_p._0_1_;
  attribute.m_size = local_d0.m_string._M_string_length;
  name.m_size = 7;
  name.m_start = "message";
  XmlWriter::writeAttribute(this_00,name,attribute);
  paVar1 = &local_d0.m_string.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_d0.m_string._M_dataplus._M_p._1_7_,local_d0.m_string._M_dataplus._M_p._0_1_)
      != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_d0.m_string._M_dataplus._M_p._1_7_,
                             local_d0.m_string._M_dataplus._M_p._0_1_),
                    local_d0.m_string.field_2._M_allocated_capacity + 1);
  }
  name_00.m_size = 4;
  name_00.m_start = "type";
  XmlWriter::writeAttribute(this_00,name_00,(stats->assertionResult).m_info.macroName);
  pSVar5 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  sVar6 = StringStreams::add(&pSVar5->super_StringStreams);
  local_70.m_index = sVar6;
  pSVar5 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  os = (ostream *)
       (pSVar5->super_StringStreams).m_streams.
       super__Vector_base<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[sVar6].m_ptr;
  local_70.m_oss = os;
  if ((stats->assertionResult).m_resultData.resultType == ExplicitSkip) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"SKIPPED\n",8);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(os,"FAILED",6);
    std::__ostream_insert<char,std::char_traits<char>>(os,":\n",2);
    if ((stats->assertionResult).m_info.capturedExpression.m_size != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"  ",2);
      AssertionResult::getExpressionInMacro_abi_cxx11_(&local_d0.m_string,&stats->assertionResult);
      std::__ostream_insert<char,std::char_traits<char>>
                (os,(char *)CONCAT71(local_d0.m_string._M_dataplus._M_p._1_7_,
                                     local_d0.m_string._M_dataplus._M_p._0_1_),
                 local_d0.m_string._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_d0.m_string._M_dataplus._M_p._1_7_,
                      local_d0.m_string._M_dataplus._M_p._0_1_) != paVar1) {
        operator_delete((undefined1 *)
                        CONCAT71(local_d0.m_string._M_dataplus._M_p._1_7_,
                                 local_d0.m_string._M_dataplus._M_p._0_1_),
                        local_d0.m_string.field_2._M_allocated_capacity + 1);
      }
      local_d0.m_string._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_d0,1);
    }
    bVar4 = AssertionResult::hasExpandedExpression(&stats->assertionResult);
    if (bVar4) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"with expansion:\n",0x10);
      AssertionResult::getExpandedExpression_abi_cxx11_(&local_60,&stats->assertionResult);
      local_d0.m_string._M_dataplus._M_p._0_1_ = SUB81(paVar1,0);
      local_d0.m_string._M_dataplus._M_p._1_7_ = (undefined7)((ulong)paVar1 >> 8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,local_60._M_dataplus._M_p,
                 local_60._M_dataplus._M_p + local_60._M_string_length);
      local_d0.m_width = 0x4f;
      local_d0.m_initialIndent = 0xffffffffffffffff;
      local_d0.m_indent = 2;
      TextFlow::operator<<(os,&local_d0);
      local_d1 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_d1,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_d0.m_string._M_dataplus._M_p._1_7_,
                      local_d0.m_string._M_dataplus._M_p._0_1_) != paVar1) {
        operator_delete((undefined1 *)
                        CONCAT71(local_d0.m_string._M_dataplus._M_p._1_7_,
                                 local_d0.m_string._M_dataplus._M_p._0_1_),
                        local_d0.m_string.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if ((stats->assertionResult).m_resultData.message._M_string_length != 0) {
    std::ostream::write((char *)os,
                        (long)(stats->assertionResult).m_resultData.message._M_dataplus._M_p);
    local_d0.m_string._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_d0,1);
  }
  pMVar8 = (stats->infoMessages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  pMVar3 = (stats->infoMessages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pMVar8 != pMVar3) {
    do {
      if (pMVar8->type == Info) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (os,(pMVar8->message)._M_dataplus._M_p,(pMVar8->message)._M_string_length);
        local_d0.m_string._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_d0,1);
      }
      pMVar8 = pMVar8 + 1;
    } while (pMVar8 != pMVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"at ",3);
  pcVar7 = (stats->assertionResult).m_info.lineInfo.file;
  local_d0.m_string._M_string_length = (stats->assertionResult).m_info.lineInfo.line;
  local_d0.m_string._M_dataplus._M_p._0_1_ = SUB81(pcVar7,0);
  local_d0.m_string._M_dataplus._M_p._1_7_ = (undefined7)((ulong)pcVar7 >> 8);
  operator<<(os,(SourceLineInfo *)&local_d0);
  std::__cxx11::stringbuf::str();
  text.m_start._1_7_ = local_d0.m_string._M_dataplus._M_p._1_7_;
  text.m_start._0_1_ = local_d0.m_string._M_dataplus._M_p._0_1_;
  text.m_size = local_d0.m_string._M_string_length;
  XmlWriter::writeText(this_00,text,Newline);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_d0.m_string._M_dataplus._M_p._1_7_,local_d0.m_string._M_dataplus._M_p._0_1_)
      != &local_d0.m_string.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_d0.m_string._M_dataplus._M_p._1_7_,
                             local_d0.m_string._M_dataplus._M_p._0_1_),
                    local_d0.m_string.field_2._M_allocated_capacity + 1);
  }
  ReusableStringStream::~ReusableStringStream(&local_70);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&stack0xffffffffffffffc0);
  if (local_90 != local_98) {
    operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
  }
  return;
}

Assistant:

void JunitReporter::writeAssertion( AssertionStats const& stats ) {
        AssertionResult const& result = stats.assertionResult;
        if ( !result.isOk() ||
             result.getResultType() == ResultWas::ExplicitSkip ) {
            std::string elementName;
            switch( result.getResultType() ) {
                case ResultWas::ThrewException:
                case ResultWas::FatalErrorCondition:
                    elementName = "error";
                    break;
                case ResultWas::ExplicitFailure:
                case ResultWas::ExpressionFailed:
                case ResultWas::DidntThrowException:
                    elementName = "failure";
                    break;
                case ResultWas::ExplicitSkip:
                    elementName = "skipped";
                    break;
                // We should never see these here:
                case ResultWas::Info:
                case ResultWas::Warning:
                case ResultWas::Ok:
                case ResultWas::Unknown:
                case ResultWas::FailureBit:
                case ResultWas::Exception:
                    elementName = "internalError";
                    break;
            }

            XmlWriter::ScopedElement e = xml.scopedElement( elementName );

            xml.writeAttribute( "message"_sr, result.getExpression() );
            xml.writeAttribute( "type"_sr, result.getTestMacroName() );

            ReusableStringStream rss;
            if ( result.getResultType() == ResultWas::ExplicitSkip ) {
                rss << "SKIPPED\n";
            } else {
                rss << "FAILED" << ":\n";
                if (result.hasExpression()) {
                    rss << "  ";
                    rss << result.getExpressionInMacro();
                    rss << '\n';
                }
                if (result.hasExpandedExpression()) {
                    rss << "with expansion:\n";
                    rss << TextFlow::Column(result.getExpandedExpression()).indent(2) << '\n';
                }
            }

            if( result.hasMessage() )
                rss << result.getMessage() << '\n';
            for( auto const& msg : stats.infoMessages )
                if( msg.type == ResultWas::Info )
                    rss << msg.message << '\n';

            rss << "at " << result.getSourceInfo();
            xml.writeText( rss.str(), XmlFormatting::Newline );
        }
    }